

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O3

int gutil::Thread::getProcessingUnits(void)

{
  uint uVar1;
  long lVar2;
  char *__nptr;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (anonymous_namespace)::procunits;
  if ((int)(anonymous_namespace)::procunits < 1) {
    lVar2 = sysconf(0x53);
    (anonymous_namespace)::procunits = (uint)lVar2;
    if ((int)(anonymous_namespace)::procunits < 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot determine number of CPUs, assuming one!",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      (anonymous_namespace)::procunits = 1;
    }
    uVar4 = (anonymous_namespace)::procunits;
    __nptr = getenv("CVKIT_MAX_THREADS");
    if (__nptr != (char *)0x0) {
      uVar1 = atoi(__nptr);
      uVar3 = 1;
      if (1 < (int)uVar1) {
        uVar3 = uVar1;
      }
      if (uVar3 < uVar4) {
        uVar4 = uVar3;
        (anonymous_namespace)::procunits = uVar3;
      }
    }
  }
  return uVar4;
}

Assistant:

int Thread::getProcessingUnits()
{
  if (procunits <= 0)
  {
#ifdef _SC_NPROCESSORS_CONF
    procunits=sysconf(_SC_NPROCESSORS_CONF);
#endif

    if (procunits <= 0)
    {
      std::cerr << "Cannot determine number of CPUs, assuming one!" << std::endl;
      procunits=1;
    }

    const char *s=std::getenv("CVKIT_MAX_THREADS");

    if (s != 0)
    {
      int n=std::max(1, std::atoi(s));

      if (n < procunits)
      {
        procunits=n;
      }
    }
  }

  return procunits;
}